

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall FfsParser::addInfoRecursive(FfsParser *this,UModelIndex *index)

{
  TreeModel *pTVar1;
  UINT64 UVar2;
  bool bVar3;
  UINT32 UVar4;
  int iVar5;
  char *pcVar6;
  int i;
  int __c;
  ulong uVar7;
  UByteArray local_68;
  UModelIndex local_48;
  
  bVar3 = UModelIndex::isValid(index);
  if (!bVar3) {
    return 1;
  }
  pTVar1 = this->model;
  UVar4 = TreeModel::offset(pTVar1,index);
  usprintf((CBString *)&local_68,"Offset: %Xh\n",(ulong)UVar4);
  TreeModel::addInfo(pTVar1,index,(CBString *)&local_68,false);
  Bstrlib::CBString::~CBString((CBString *)&local_68);
  bVar3 = TreeModel::compressed(this->model,index);
  if (bVar3) {
    UModelIndex::parent((UModelIndex *)&local_68,index);
    if ((((int)local_68.d._M_dataplus._M_p < 0) || (local_68.d._M_dataplus._M_p._4_4_ < 0)) ||
       ((TreeModel *)local_68.d.field_2._M_allocated_capacity == (TreeModel *)0x0))
    goto LAB_0011f9ef;
    pTVar1 = this->model;
    UModelIndex::parent(&local_48,index);
    bVar3 = TreeModel::compressed(pTVar1,&local_48);
    if (bVar3) goto LAB_0011f9ef;
  }
  UVar2 = this->addressDiff;
  UVar4 = TreeModel::base(this->model,index);
  uVar7 = UVar4 + UVar2;
  if (uVar7 >> 0x20 == 0) {
    TreeModel::header(&local_68,this->model,index);
    std::__cxx11::string::~string((string *)&local_68);
    pTVar1 = this->model;
    if ((int)local_68.d._M_string_length == 0) {
      usprintf((CBString *)&local_68,"Address: %08Xh\n",uVar7 & 0xffffffff);
      TreeModel::addInfo(pTVar1,index,(CBString *)&local_68,false);
    }
    else {
      usprintf((CBString *)&local_68,"Data address: %08Xh\n",
               (ulong)(uint)((int)local_68.d._M_string_length + (int)uVar7));
      TreeModel::addInfo(pTVar1,index,(CBString *)&local_68,false);
      Bstrlib::CBString::~CBString((CBString *)&local_68);
      pTVar1 = this->model;
      usprintf((CBString *)&local_68,"Header address: %08Xh\n",uVar7 & 0xffffffff);
      TreeModel::addInfo(pTVar1,index,(CBString *)&local_68,false);
    }
    Bstrlib::CBString::~CBString((CBString *)&local_68);
  }
  pTVar1 = this->model;
  UVar4 = TreeModel::base(pTVar1,index);
  usprintf((CBString *)&local_68,"Base: %Xh\n",(ulong)UVar4);
  TreeModel::addInfo(pTVar1,index,(CBString *)&local_68,false);
  Bstrlib::CBString::~CBString((CBString *)&local_68);
LAB_0011f9ef:
  pTVar1 = this->model;
  bVar3 = TreeModel::fixed(pTVar1,index);
  pcVar6 = "No";
  if (bVar3) {
    pcVar6 = "Yes";
  }
  usprintf((CBString *)&local_68,"Fixed: %s\n",pcVar6);
  TreeModel::addInfo(pTVar1,index,(CBString *)&local_68,false);
  Bstrlib::CBString::~CBString((CBString *)&local_68);
  for (__c = 0; iVar5 = TreeModel::rowCount(this->model,index), __c < iVar5; __c = __c + 1) {
    TreeModel::index((TreeModel *)&local_68,(char *)index->m,__c);
    addInfoRecursive(this,(UModelIndex *)&local_68);
  }
  return 0;
}

Assistant:

USTATUS FfsParser::addInfoRecursive(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return U_INVALID_PARAMETER;
    
    // Add offset
    model->addInfo(index, usprintf("Offset: %Xh\n", model->offset(index)), false);
    
    // Add current base if the element is not compressed
    // or it's compressed, but its parent isn't
    if ((!model->compressed(index)) || (index.parent().isValid() && !model->compressed(index.parent()))) {
        // Add physical address of the whole item or its header and data portions separately
        UINT64 address = addressDiff + model->base(index);
        if (address <= 0xFFFFFFFFUL) {
            UINT32 headerSize = (UINT32)model->header(index).size();
            if (headerSize) {
                model->addInfo(index, usprintf("Data address: %08Xh\n", (UINT32)address + headerSize),false);
                model->addInfo(index, usprintf("Header address: %08Xh\n", (UINT32)address), false);
            }
            else {
                model->addInfo(index, usprintf("Address: %08Xh\n", (UINT32)address), false);
            }
        }
        // Add base
        model->addInfo(index, usprintf("Base: %Xh\n", model->base(index)), false);
    }
    model->addInfo(index, usprintf("Fixed: %s\n", model->fixed(index) ? "Yes" : "No"), false);
    
    // Process child items
    for (int i = 0; i < model->rowCount(index); i++) {
        addInfoRecursive(index.model()->index(i, 0, index));
    }
    
    return U_SUCCESS;
}